

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2espec.cc
# Opt level: O0

fdb_kvs_handle * scan(storage_t *st,fdb_kvs_handle *reuse_kv)

{
  bool bVar1;
  int iVar2;
  fdb_status fVar3;
  long in_RSI;
  fdb_doc *rdoc;
  fdb_iterator *it;
  fdb_status status;
  idx_prams_t params;
  fdb_kvs_handle *snap_kv;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_seqnum_t in_stack_00000200;
  fdb_kvs_handle **in_stack_00000208;
  fdb_kvs_handle *in_stack_00000210;
  undefined2 uVar4;
  undefined2 uVar5;
  undefined4 in_stack_ffffffffffffff5c;
  fdb_iterator *iterator;
  fdb_iterator *local_90;
  fdb_status local_84;
  char local_80 [12];
  char acStack_74 [12];
  fdb_kvs_handle *local_68;
  idx_prams_t *in_stack_ffffffffffffffb0;
  fdb_doc **in_stack_ffffffffffffffd0;
  fdb_iterator *in_stack_ffffffffffffffd8;
  timeval local_20;
  long local_10;
  
  local_10 = in_RSI;
  gettimeofday(&local_20,(__timezone_ptr_t)0x0);
  iterator = (fdb_iterator *)0x0;
  gen_index_params(in_stack_ffffffffffffffb0);
  if (local_10 == 0) {
    local_84 = fdb_snapshot_open(in_stack_00000210,in_stack_00000208,in_stack_00000200);
    if (local_84 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
              ,0x1ce);
      scan::__test_pass = 0;
      if (local_84 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
                      ,0x1ce,"fdb_kvs_handle *scan(storage_t *, fdb_kvs_handle *)");
      }
    }
  }
  else {
    local_84 = fdb_snapshot_open(in_stack_00000210,in_stack_00000208,in_stack_00000200);
    if (local_84 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
              ,0x1cb);
      scan::__test_pass = 0;
      if (local_84 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
                      ,0x1cb,"fdb_kvs_handle *scan(storage_t *, fdb_kvs_handle *)");
      }
    }
  }
  uVar4 = 0;
  uVar5 = 0;
  local_84 = fdb_iterator_init(local_68,&local_90,local_80,0xc,acStack_74,0xc,0);
  if (local_84 == FDB_RESULT_SUCCESS) {
    local_84 = FDB_RESULT_SUCCESS;
    do {
      local_84 = fdb_iterator_get(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      if (local_84 == FDB_RESULT_SUCCESS) {
        iVar2 = strcmp((char *)iterator->_seqnum,local_80);
        if ((iVar2 < 0) || (iVar2 = strcmp((char *)iterator->_seqnum,acStack_74), 0 < iVar2)) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
                  ,0x1db);
          scan::__test_pass = 0;
          iVar2 = strcmp((char *)iterator->_seqnum,local_80);
          bVar1 = false;
          if (-1 < iVar2) {
            iVar2 = strcmp((char *)iterator->_seqnum,acStack_74);
            bVar1 = iVar2 < 1;
          }
          if (!bVar1) {
            __assert_fail("((strcmp((char *)rdoc->key,params.min) >= 0) && (strcmp((char *)rdoc->key, params.max) <= 0))"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
                          ,0x1db,"fdb_kvs_handle *scan(storage_t *, fdb_kvs_handle *)");
          }
        }
        fdb_doc_free((fdb_doc *)0x10b663);
        iterator = (fdb_iterator *)0x0;
      }
      fVar3 = fdb_iterator_next((fdb_iterator *)
                                CONCAT44(in_stack_ffffffffffffff5c,CONCAT22(uVar5,uVar4)));
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
  }
  fdb_iterator_close(iterator);
  return local_68;
}

Assistant:

fdb_kvs_handle * scan(storage_t *st, fdb_kvs_handle *reuse_kv)
{
    TEST_INIT();

    fdb_kvs_handle *snap_kv;
    idx_prams_t params;
    fdb_status status;
    fdb_iterator *it;
    fdb_doc *rdoc = NULL;

    // generate params
    gen_index_params(&params);

    // create new snapkv or reuse current
    if(reuse_kv){
        status = fdb_snapshot_open(reuse_kv, &snap_kv, FDB_SNAPSHOT_INMEM);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    } else {
        status = fdb_snapshot_open(st->index1, &snap_kv, FDB_SNAPSHOT_INMEM);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // iterate over snapkv
    status = fdb_iterator_init(snap_kv, &it, params.min, 12,
                               params.max, 12, FDB_ITR_NONE);
    if (status == FDB_RESULT_SUCCESS) {
        do {
            status = fdb_iterator_get(it, &rdoc);
            if (status == FDB_RESULT_SUCCESS){

                // make sure every doc is within requested range
                TEST_CHK(((strcmp((char *)rdoc->key,params.min) >= 0) &&
                       (strcmp((char *)rdoc->key, params.max) <= 0)));
                fdb_doc_free(rdoc);
                rdoc=NULL;
            }
        } while (fdb_iterator_next(it) != FDB_RESULT_ITERATOR_FAIL);
    }

    fdb_iterator_close(it);

    return snap_kv;
}